

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

char * make_filename(int index,char *subname)

{
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  char *pcVar3;
  strbuf *out;
  char *pcVar4;
  char *__name;
  char *pcVar5;
  char *pcVar6;
  
  switch(index) {
  case 0:
    pcVar4 = getenv("PUTTYDIR");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = getenv("HOME");
      __uid = getuid();
      ppVar2 = getpwuid(__uid);
      if ((ppVar2 == (passwd *)0x0) || (pcVar5 = ppVar2->pw_dir, pcVar5 == (char *)0x0)) {
        pcVar5 = (char *)0x0;
      }
      pcVar3 = getenv("XDG_CONFIG_HOME");
      if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
        pcVar3 = (char *)0x0;
      }
      else {
        pcVar3 = dupprintf("%s/putty");
      }
      if (pcVar3 == (char *)0x0) {
        pcVar3 = dupprintf("%s/.config/putty");
      }
      if ((pcVar3 != (char *)0x0) && (iVar1 = access(pcVar3,0), iVar1 == 0)) {
        return pcVar3;
      }
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = dupprintf("%s/.putty");
      }
      if (pcVar5 == (char *)0x0) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = dupprintf("%s/.putty");
      }
      __name = dupstr("/.putty");
      if ((((pcVar4 == (char *)0x0) || (iVar1 = access(pcVar4,0), pcVar6 = pcVar4, iVar1 != 0)) &&
          ((pcVar5 == (char *)0x0 || (iVar1 = access(pcVar5,0), pcVar6 = pcVar5, iVar1 != 0)))) &&
         (iVar1 = access(__name,0), pcVar6 = __name, iVar1 != 0)) {
        pcVar6 = pcVar5;
        if (pcVar5 == (char *)0x0) {
          pcVar6 = __name;
        }
        if (pcVar4 != (char *)0x0) {
          pcVar6 = pcVar4;
        }
      }
      if (pcVar6 != pcVar4) {
        safefree(pcVar4);
      }
      if (pcVar6 != pcVar5) {
        safefree(pcVar5);
      }
      if (pcVar6 != __name) {
        safefree(__name);
      }
      if (pcVar6 == pcVar3) {
        return pcVar6;
      }
      safefree(pcVar3);
      return pcVar6;
    }
    break;
  case 1:
    pcVar4 = getenv("PUTTYSSHHOSTKEYS");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = make_filename(0,(char *)0x0);
      pcVar5 = "%s/sshhostkeys";
      goto LAB_00141a62;
    }
    break;
  case 2:
    pcVar4 = make_filename(1,(char *)0x0);
    pcVar5 = "%s.tmp";
    goto LAB_00141a62;
  case 3:
    pcVar4 = getenv("PUTTYRANDOMSEED");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = make_filename(0,(char *)0x0);
      pcVar5 = "%s/randomseed";
      goto LAB_00141a62;
    }
    break;
  case 4:
    pcVar4 = getenv("PUTTYSESSIONS");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = make_filename(0,(char *)0x0);
      pcVar5 = "%s/sessions";
      goto LAB_00141a62;
    }
    break;
  case 5:
    out = strbuf_new();
    iVar1 = 4;
    goto LAB_001419d5;
  case 6:
    pcVar4 = getenv("PUTTYSSHHOSTCAS");
    if (pcVar4 == (char *)0x0) {
      pcVar4 = make_filename(0,(char *)0x0);
      pcVar5 = "%s/sshhostcas";
      goto LAB_00141a62;
    }
    break;
  case 7:
    out = strbuf_new();
    iVar1 = 6;
LAB_001419d5:
    pcVar4 = make_filename(iVar1,(char *)0x0);
    BinarySink_put_fmt(out->binarysink_,"%s/",pcVar4);
    safefree(pcVar4);
    make_session_filename(subname,out);
    pcVar4 = strbuf_to_str(out);
    return pcVar4;
  default:
    pcVar4 = make_filename(0,(char *)0x0);
    pcVar5 = "%s/ERROR";
LAB_00141a62:
    pcVar5 = dupprintf(pcVar5,pcVar4);
    safefree(pcVar4);
    return pcVar5;
  }
  pcVar4 = dupstr(pcVar4);
  return pcVar4;
}

Assistant:

static char *make_filename(int index, const char *subname)
{
    char *env, *tmp, *ret;

    /*
     * Allow override of the PuTTY configuration location, and of
     * specific subparts of it, by means of environment variables.
     */
    if (index == INDEX_DIR) {
        struct passwd *pwd;
        char *xdg_dir, *old_dir, *old_dir2, *old_dir3, *home, *pwd_home;

        env = getenv("PUTTYDIR");
        if (env)
            return dupstr(env);

        home = getenv("HOME");
        pwd = getpwuid(getuid());
        if (pwd && pwd->pw_dir) {
            pwd_home = pwd->pw_dir;
        } else {
            pwd_home = NULL;
        }

        xdg_dir = NULL;
        env = getenv("XDG_CONFIG_HOME");
        if (env && *env) {
            xdg_dir = dupprintf("%s/putty", env);
        }
        if (!xdg_dir) {
            if (home) {
                tmp = home;
            } else if (pwd_home) {
                tmp = pwd_home;
            } else {
                tmp = "";
            }
            xdg_dir = dupprintf("%s/.config/putty", tmp);
        }
        if (xdg_dir && access(xdg_dir, F_OK) == 0) {
            return xdg_dir;
        }

        old_dir = old_dir2 = old_dir3 = NULL;
        if (home) {
            old_dir = dupprintf("%s/.putty", home);
        }
        if (pwd_home) {
            old_dir2 = dupprintf("%s/.putty", pwd_home);
        }
        old_dir3 = dupstr("/.putty");

        if (old_dir && access(old_dir, F_OK) == 0) {
            ret = old_dir;
            goto out;
        }
        if (old_dir2 && access(old_dir2, F_OK) == 0) {
            ret = old_dir2;
            goto out;
        }
        if (access(old_dir3, F_OK) == 0) {
            ret = old_dir3;
            goto out;
        }
#ifdef XDG_DEFAULT
        if (xdg_dir) {
            ret = xdg_dir;
            goto out;
        }
#endif
        ret = old_dir ? old_dir : (old_dir2 ? old_dir2 : old_dir3);

      out:
        if (ret != old_dir)
            sfree(old_dir);
        if (ret != old_dir2)
            sfree(old_dir2);
        if (ret != old_dir3)
            sfree(old_dir3);
        if (ret != xdg_dir)
            sfree(xdg_dir);
        return ret;
    }
    if (index == INDEX_SESSIONDIR) {
        env = getenv("PUTTYSESSIONS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sessions", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_SESSION) {
        strbuf *sb = strbuf_new();
        tmp = make_filename(INDEX_SESSIONDIR, NULL);
        put_fmt(sb, "%s/", tmp);
        sfree(tmp);
        make_session_filename(subname, sb);
        return strbuf_to_str(sb);
    }
    if (index == INDEX_HOSTKEYS) {
        env = getenv("PUTTYSSHHOSTKEYS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sshhostkeys", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTKEYS_TMP) {
        tmp = make_filename(INDEX_HOSTKEYS, NULL);
        ret = dupprintf("%s.tmp", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_RANDSEED) {
        env = getenv("PUTTYRANDOMSEED");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/randomseed", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTCADIR) {
        env = getenv("PUTTYSSHHOSTCAS");
        if (env)
            return dupstr(env);
        tmp = make_filename(INDEX_DIR, NULL);
        ret = dupprintf("%s/sshhostcas", tmp);
        sfree(tmp);
        return ret;
    }
    if (index == INDEX_HOSTCA) {
        strbuf *sb = strbuf_new();
        tmp = make_filename(INDEX_HOSTCADIR, NULL);
        put_fmt(sb, "%s/", tmp);
        sfree(tmp);
        make_session_filename(subname, sb);
        return strbuf_to_str(sb);
    }
    tmp = make_filename(INDEX_DIR, NULL);
    ret = dupprintf("%s/ERROR", tmp);
    sfree(tmp);
    return ret;
}